

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O2

void Abc_NtkFaninFanoutCounters
               (Abc_Ntk_t *pNtk,Vec_Int_t *vFan,Vec_Int_t *vFon,Vec_Int_t *vFanR,Vec_Int_t *vFonR)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int Fill;
  int Fill_00;
  int Fill_01;
  int Addition;
  int Addition_00;
  Vec_Int_t *pVVar3;
  Vec_Int_t *extraout_RDX;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar4 = 0;
  iVar5 = 0;
  pVVar3 = vFon;
  for (iVar6 = 0; iVar6 < pNtk->vObjs->nSize; iVar6 = iVar6 + 1) {
    pAVar2 = Abc_NtkObj(pNtk,iVar6);
    if (pAVar2 != (Abc_Obj_t *)0x0) {
      iVar1 = (pAVar2->vFanins).nSize;
      if (iVar4 <= iVar1) {
        iVar4 = iVar1;
      }
      iVar1 = (pAVar2->vFanouts).nSize;
      if (iVar5 <= iVar1) {
        iVar5 = iVar1;
      }
    }
    pVVar3 = extraout_RDX;
  }
  Vec_IntFill(vFan,iVar4 + 1,(int)pVVar3);
  Vec_IntFill(vFon,iVar5 + 1,Fill);
  Vec_IntFill(vFanR,iVar4 + 1,Fill_00);
  Vec_IntFill(vFonR,iVar5 + 1,Fill_01);
  iVar4 = pNtk->vObjs->nSize;
  while (0 < iVar4) {
    iVar4 = iVar4 + -1;
    pAVar2 = Abc_NtkObj(pNtk,iVar4);
    if (pAVar2 != (Abc_Obj_t *)0x0) {
      iVar5 = (pAVar2->vFanins).nSize;
      iVar6 = (pAVar2->vFanouts).nSize;
      Vec_IntAddToEntry(vFan,iVar5,Addition);
      Vec_IntAddToEntry(vFon,iVar6,Addition_00);
      Vec_IntWriteEntry(vFanR,iVar5,iVar4);
      Vec_IntWriteEntry(vFonR,iVar6,iVar4);
    }
  }
  return;
}

Assistant:

void Abc_NtkFaninFanoutCounters( Abc_Ntk_t * pNtk, Vec_Int_t * vFan, Vec_Int_t * vFon, Vec_Int_t * vFanR, Vec_Int_t * vFonR )
{
    Abc_Obj_t * pNode;
    int i, nFanins, nFanouts;
    int nFaninsMax = 0, nFanoutsMax = 0;
    Abc_NtkForEachObj( pNtk, pNode, i )
    {
        nFaninsMax  = Abc_MaxInt( nFaninsMax,  Abc_ObjFaninNum(pNode) );
        nFanoutsMax = Abc_MaxInt( nFanoutsMax, Abc_ObjFanoutNum(pNode) );
    }
    Vec_IntFill( vFan, nFaninsMax + 1, 0 );
    Vec_IntFill( vFon, nFanoutsMax + 1, 0 );
    Vec_IntFill( vFanR, nFaninsMax + 1, 0 );
    Vec_IntFill( vFonR, nFanoutsMax + 1, 0 );
    Abc_NtkForEachObjReverse( pNtk, pNode, i )
    {
        nFanins  = Abc_ObjFaninNum( pNode );
        nFanouts = Abc_ObjFanoutNum( pNode );
        Vec_IntAddToEntry( vFan,  nFanins, 1 );
        Vec_IntAddToEntry( vFon, nFanouts, 1 );
        Vec_IntWriteEntry( vFanR, nFanins, i );
        Vec_IntWriteEntry( vFonR, nFanouts, i );
    }
}